

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void absl::lts_20250127::container_internal::anon_unknown_2::DropDeletesWithoutResize
               (CommonFields *common,PolicyFunctions *policy)

{
  _func_size_t_void_ptr_void_ptr *p_Var1;
  _func_void_void_ptr_void_ptr_void_ptr *p_Var2;
  size_t slot_size_00;
  bool bVar3;
  h2_t hVar4;
  void *slot_array_00;
  size_t n;
  ctrl_t *ctrl_00;
  void *pvVar5;
  void *pvVar6;
  size_t hash_00;
  size_t sVar7;
  size_t sVar8;
  FindInfo FVar9;
  HashtablezInfoHandle local_e1;
  void *local_e0;
  void *tmp_space;
  void *new_slot_ptr;
  anon_class_16_2_00261111 probe_index;
  size_t probe_offset;
  size_t new_i;
  FindInfo target;
  size_t hash;
  size_t i;
  size_t tmp_space_id;
  size_t kUnknownId;
  void *slot_ptr;
  size_t total_probe_length;
  size_t slot_size;
  _func_void_void_ptr_void_ptr_void_ptr *transfer;
  _func_size_t_void_ptr_void_ptr *hasher;
  void *hash_fn;
  ctrl_t *ctrl;
  size_t capacity;
  void *slot_array;
  void *set;
  PolicyFunctions *policy_local;
  CommonFields *common_local;
  
  slot_array_00 = CommonFields::slot_array(common);
  n = CommonFields::capacity(common);
  bVar3 = IsValidCapacity(n);
  if (!bVar3) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0xd0,
                  "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                 );
  }
  bVar3 = is_small(n);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    ctrl_00 = CommonFields::control(common);
    ConvertDeletedToEmptyAndFullToDeleted(ctrl_00,n);
    pvVar5 = (*policy->hash_fn)(common);
    p_Var1 = policy->hash_slot;
    p_Var2 = policy->transfer;
    slot_size_00 = policy->slot_size;
    slot_ptr = (void *)0x0;
    kUnknownId = (size_t)SlotAddress(slot_array_00,0,slot_size_00);
    i = 0xffffffffffffffff;
    hash = 0;
    while( true ) {
      if (hash == n) {
        ResetGrowthLeft(common);
        CommonFields::infoz(common);
        HashtablezInfoHandle::RecordRehash(&local_e1,(size_t)slot_ptr);
        return;
      }
      pvVar6 = SlotAddress(slot_array_00,hash,slot_size_00);
      if ((void *)kUnknownId != pvVar6) break;
      bVar3 = IsEmpty(ctrl_00[hash]);
      if (bVar3) {
        i = hash;
      }
      else {
        bVar3 = IsDeleted(ctrl_00[hash]);
        if (bVar3) {
          hash_00 = (*p_Var1)(pvVar5,(void *)kUnknownId);
          FVar9 = find_first_non_full<void>(common,hash_00);
          new_i = FVar9.offset;
          target.offset = FVar9.probe_length;
          slot_ptr = (void *)(target.offset + (long)slot_ptr);
          probe((probe_seq<16UL> *)&probe_index.capacity,common,hash_00);
          new_slot_ptr = (void *)probe_seq<16UL>::offset((probe_seq<16UL> *)&probe_index.capacity);
          probe_index.probe_offset = n;
          sVar7 = DropDeletesWithoutResize::anon_class_16_2_00261111::operator()
                            ((anon_class_16_2_00261111 *)&new_slot_ptr,new_i);
          sVar8 = DropDeletesWithoutResize::anon_class_16_2_00261111::operator()
                            ((anon_class_16_2_00261111 *)&new_slot_ptr,hash);
          if (sVar7 == sVar8) {
            hVar4 = H2(hash_00);
            SetCtrl(common,hash,hVar4,slot_size_00);
          }
          else {
            tmp_space = SlotAddress(slot_array_00,new_i,slot_size_00);
            bVar3 = IsEmpty(ctrl_00[new_i]);
            if (bVar3) {
              hVar4 = H2(hash_00);
              SetCtrl(common,new_i,hVar4,slot_size_00);
              (*p_Var2)(common,tmp_space,(void *)kUnknownId);
              SetCtrl(common,hash,kEmpty,slot_size_00);
              i = hash;
            }
            else {
              bVar3 = IsDeleted(ctrl_00[new_i]);
              if (!bVar3) {
                __assert_fail("IsDeleted(ctrl[new_i])",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                              ,0x117,
                              "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                             );
              }
              hVar4 = H2(hash_00);
              SetCtrl(common,new_i,hVar4,slot_size_00);
              if (i == 0xffffffffffffffff) {
                i = FindEmptySlot(hash + 1,n,ctrl_00);
              }
              local_e0 = SlotAddress(slot_array_00,i,slot_size_00);
              SanitizerUnpoisonMemoryRegion(local_e0,slot_size_00);
              (*p_Var2)(common,local_e0,tmp_space);
              (*p_Var2)(common,tmp_space,(void *)kUnknownId);
              (*p_Var2)(common,(void *)kUnknownId,local_e0);
              SanitizerPoisonMemoryRegion(local_e0,slot_size_00);
              hash = hash - 1;
              kUnknownId = (size_t)PrevSlot((void *)kUnknownId,slot_size_00);
            }
          }
        }
      }
      hash = hash + 1;
      kUnknownId = (size_t)NextSlot((void *)kUnknownId,slot_size_00);
    }
    __assert_fail("slot_ptr == SlotAddress(slot_array, i, slot_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0xf3,
                  "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
                 );
  }
  __assert_fail("!is_small(capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0xd1,
                "void absl::container_internal::(anonymous namespace)::DropDeletesWithoutResize(CommonFields &, const PolicyFunctions &)"
               );
}

Assistant:

void DropDeletesWithoutResize(CommonFields& common,
                              const PolicyFunctions& policy) {
  void* set = &common;
  void* slot_array = common.slot_array();
  const size_t capacity = common.capacity();
  assert(IsValidCapacity(capacity));
  assert(!is_small(capacity));
  // Algorithm:
  // - mark all DELETED slots as EMPTY
  // - mark all FULL slots as DELETED
  // - for each slot marked as DELETED
  //     hash = Hash(element)
  //     target = find_first_non_full(hash)
  //     if target is in the same group
  //       mark slot as FULL
  //     else if target is EMPTY
  //       transfer element to target
  //       mark slot as EMPTY
  //       mark target as FULL
  //     else if target is DELETED
  //       swap current element with target element
  //       mark target as FULL
  //       repeat procedure for current slot with moved from element (target)
  ctrl_t* ctrl = common.control();
  ConvertDeletedToEmptyAndFullToDeleted(ctrl, capacity);
  const void* hash_fn = policy.hash_fn(common);
  auto hasher = policy.hash_slot;
  auto transfer = policy.transfer;
  const size_t slot_size = policy.slot_size;

  size_t total_probe_length = 0;
  void* slot_ptr = SlotAddress(slot_array, 0, slot_size);

  // The index of an empty slot that can be used as temporary memory for
  // the swap operation.
  constexpr size_t kUnknownId = ~size_t{};
  size_t tmp_space_id = kUnknownId;

  for (size_t i = 0; i != capacity;
       ++i, slot_ptr = NextSlot(slot_ptr, slot_size)) {
    assert(slot_ptr == SlotAddress(slot_array, i, slot_size));
    if (IsEmpty(ctrl[i])) {
      tmp_space_id = i;
      continue;
    }
    if (!IsDeleted(ctrl[i])) continue;
    const size_t hash = (*hasher)(hash_fn, slot_ptr);
    const FindInfo target = find_first_non_full(common, hash);
    const size_t new_i = target.offset;
    total_probe_length += target.probe_length;

    // Verify if the old and new i fall within the same group wrt the hash.
    // If they do, we don't need to move the object as it falls already in the
    // best probe we can.
    const size_t probe_offset = probe(common, hash).offset();
    const auto probe_index = [probe_offset, capacity](size_t pos) {
      return ((pos - probe_offset) & capacity) / Group::kWidth;
    };

    // Element doesn't move.
    if (ABSL_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
      SetCtrl(common, i, H2(hash), slot_size);
      continue;
    }

    void* new_slot_ptr = SlotAddress(slot_array, new_i, slot_size);
    if (IsEmpty(ctrl[new_i])) {
      // Transfer element to the empty spot.
      // SetCtrl poisons/unpoisons the slots so we have to call it at the
      // right time.
      SetCtrl(common, new_i, H2(hash), slot_size);
      (*transfer)(set, new_slot_ptr, slot_ptr);
      SetCtrl(common, i, ctrl_t::kEmpty, slot_size);
      // Initialize or change empty space id.
      tmp_space_id = i;
    } else {
      assert(IsDeleted(ctrl[new_i]));
      SetCtrl(common, new_i, H2(hash), slot_size);
      // Until we are done rehashing, DELETED marks previously FULL slots.

      if (tmp_space_id == kUnknownId) {
        tmp_space_id = FindEmptySlot(i + 1, capacity, ctrl);
      }
      void* tmp_space = SlotAddress(slot_array, tmp_space_id, slot_size);
      SanitizerUnpoisonMemoryRegion(tmp_space, slot_size);

      // Swap i and new_i elements.
      (*transfer)(set, tmp_space, new_slot_ptr);
      (*transfer)(set, new_slot_ptr, slot_ptr);
      (*transfer)(set, slot_ptr, tmp_space);

      SanitizerPoisonMemoryRegion(tmp_space, slot_size);

      // repeat the processing of the ith slot
      --i;
      slot_ptr = PrevSlot(slot_ptr, slot_size);
    }
  }
  ResetGrowthLeft(common);
  common.infoz().RecordRehash(total_probe_length);
}